

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharGraph.cpp
# Opt level: O1

int __thiscall
Hpipe::CharGraph::clone(CharGraph *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  char **args_2;
  pointer pAVar1;
  void *__arg_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  CharGraph *pCVar9;
  char cVar10;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RAX;
  size_t sVar16;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX;
  Lexem *pLVar17;
  long *plVar18;
  Lexem *pLVar19;
  pointer *ppbVar20;
  Lexem *pLVar21;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_00;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_01;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_02;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_03;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_04;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_05;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_06;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_07;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_08;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_09;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pVVar22;
  vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_> *this_00;
  char *in_R9;
  long lVar23;
  Arg *arg;
  pointer src;
  Vec<Hpipe::CharGraph::Arg> cargs;
  Vec<Hpipe::CharGraph::Arg> *__range3;
  Lexem *ch;
  bool local_2d1;
  undefined1 local_2c0 [32];
  long *local_2a0;
  CharGraph *local_298;
  Vec<Hpipe::CharGraph::Arg> *local_290;
  pointer *local_288;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_280;
  string *local_278;
  Pool<Hpipe::Lexem,32> *local_270;
  Lexem *local_268;
  long local_260;
  undefined1 local_258 [56];
  Lexem *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_208 [32];
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  undefined1 local_c8 [32];
  char *local_a8;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_a0;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_98;
  string local_90;
  Lexem *local_70;
  vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_> local_68;
  vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_> local_48;
  
  pLVar17 = (Lexem *)*___flags;
  if (pLVar17 != (Lexem *)0x0) {
    local_270 = (Pool<Hpipe::Lexem,32> *)&this->le_pool;
    in_RAX = &this->calls;
    local_2a0 = ___flags;
    local_298 = this;
    local_290 = (Vec<Hpipe::CharGraph::Arg> *)__arg;
    local_288 = (pointer *)__fn;
    local_280 = (Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__child_stack;
    local_a8 = in_R9;
    local_a0 = in_RAX;
    do {
      pcVar11 = local_a8;
      pLVar19 = (Lexem *)(local_2c0 + 0x10);
      if (local_a8 == (char *)0x0) {
        bVar12 = false;
      }
      else {
        local_c8._0_8_ = local_c8 + 0x10;
        sVar16 = strlen(local_a8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,pcVar11,pcVar11 + sVar16)
        ;
        bVar12 = Lexem::eq(pLVar17,OPERATOR,(string *)local_c8);
        in_RAX = (Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_c8 + 0x10);
        if ((Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
            )local_c8._0_8_ != in_RAX) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
          in_RAX = extraout_RAX;
        }
      }
      if (bVar12 != false) break;
      if ((*(int *)(*local_2a0 + 0x28) == 1) &&
         (iVar15 = std::__cxx11::string::compare((char *)(*local_2a0 + 8)), iVar15 != 0)) {
        local_68.super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_00 = &local_68;
        clone(local_298,(__fn *)local_288,local_280,(int)(void *)*local_2a0 + 8,(void *)*local_2a0,
              this_00,local_290);
LAB_0013d5e0:
        std::vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>::~vector(this_00)
        ;
      }
      else {
        local_2c0._16_2_ = 0x5b;
        local_2c0._8_8_ = (pointer)0x1;
        local_2c0._0_8_ = pLVar19;
        bVar12 = Lexem::eq((Lexem *)*local_2a0,OPERATOR,(string *)local_2c0);
        if ((Lexem *)local_2c0._0_8_ != pLVar19) {
          operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
        }
        if (bVar12) {
          pLVar17 = *(Lexem **)(*local_2a0 + 0x38);
          local_2c0._8_8_ = (pointer)0x4;
          local_2c0._16_5_ = 0x70696b73;
          local_2c0._0_8_ = pLVar19;
          bVar13 = Lexem::eq(pLVar17,(string *)local_2c0);
          local_278 = (string *)CONCAT71(local_278._1_7_,bVar13);
          if (bVar13) {
LAB_0013ce59:
            local_2d1 = true;
            bVar8 = false;
            bVar7 = false;
            bVar6 = false;
            bVar5 = false;
            bVar4 = false;
            bVar3 = false;
            bVar2 = false;
            bVar14 = false;
            bVar13 = false;
          }
          else {
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            local_e8.field_2._M_allocated_capacity._0_4_ = 0x5f646461;
            local_e8._M_string_length = 7;
            local_e8.field_2._M_allocated_capacity._4_4_ = 0x727473;
            bVar13 = Lexem::eq(pLVar17,&local_e8);
            if (bVar13) goto LAB_0013ce59;
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            local_108.field_2._M_allocated_capacity._0_4_ = 0x5f726c63;
            local_108._M_string_length = 7;
            local_108.field_2._M_allocated_capacity._4_4_ = 0x727473;
            bVar13 = Lexem::eq(pLVar17,&local_108);
            if (bVar13) {
              bVar7 = false;
LAB_0013cf44:
              bVar6 = false;
LAB_0013cf47:
              bVar5 = false;
LAB_0013cf49:
              bVar4 = false;
LAB_0013cf4c:
              bVar3 = false;
LAB_0013cf4e:
              bVar2 = false;
LAB_0013cf51:
              bVar14 = false;
LAB_0013cf53:
              bVar8 = true;
              bVar13 = false;
              local_2d1 = true;
            }
            else {
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              local_128.field_2._M_allocated_capacity._0_4_ = 0x5f676562;
              local_128._M_string_length = 7;
              local_128.field_2._M_allocated_capacity._4_4_ = 0x727473;
              bVar13 = Lexem::eq(pLVar17,&local_128);
              if (bVar13) {
                bVar7 = true;
                goto LAB_0013cf44;
              }
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              local_148.field_2._M_allocated_capacity = 0x5f7274735f676562;
              local_148.field_2._8_4_ = 0x7478656e;
              local_148._M_string_length = 0xc;
              local_148.field_2._M_local_buf[0xc] = '\0';
              bVar13 = Lexem::eq(pLVar17,&local_148);
              if (bVar13) {
                bVar7 = true;
                bVar6 = true;
                goto LAB_0013cf47;
              }
              local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
              local_168.field_2._M_allocated_capacity._0_4_ = 0x5f646e65;
              local_168._M_string_length = 7;
              local_168.field_2._M_allocated_capacity._4_4_ = 0x727473;
              bVar13 = Lexem::eq(pLVar17,&local_168);
              if (bVar13) {
                bVar7 = true;
                bVar6 = true;
                bVar5 = true;
                goto LAB_0013cf49;
              }
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
              local_188.field_2._M_allocated_capacity = 0x5f7274735f646e65;
              local_188.field_2._8_4_ = 0x7478656e;
              local_188._M_string_length = 0xc;
              local_188.field_2._M_local_buf[0xc] = '\0';
              bVar13 = Lexem::eq(pLVar17,&local_188);
              if (bVar13) {
                bVar7 = true;
                bVar6 = true;
                bVar5 = true;
                bVar4 = true;
                goto LAB_0013cf4c;
              }
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              local_1a8.field_2._M_allocated_capacity._0_7_ = 0x636e695f646461;
              local_1a8.field_2._7_4_ = 0x6564756c;
              local_1a8._M_string_length = 0xb;
              local_1a8.field_2._M_local_buf[0xb] = '\0';
              bVar13 = Lexem::eq(pLVar17,&local_1a8);
              if (bVar13) {
                bVar7 = true;
                bVar6 = true;
                bVar5 = true;
                bVar4 = true;
                bVar3 = true;
                goto LAB_0013cf4e;
              }
              local_208._0_8_ = local_208 + 0x10;
              local_208._16_8_ = (Lexem *)0x6c6572705f646461;
              local_208._8_8_ = (Lexem *)0x8;
              local_208[0x18] = '\0';
              bVar13 = Lexem::eq(pLVar17,(string *)local_208);
              if (bVar13) {
                bVar7 = true;
                bVar6 = true;
                bVar5 = true;
                bVar4 = true;
                bVar3 = true;
                bVar2 = true;
                goto LAB_0013cf51;
              }
              local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
              local_1c8.field_2._8_7_ = 0x7972616e696d69;
              local_1c8.field_2._M_allocated_capacity._0_7_ = 0x6572705f646461;
              local_1c8.field_2._M_local_buf[7] = 'l';
              local_1c8._M_string_length = 0xf;
              local_1c8.field_2._M_local_buf[0xf] = '\0';
              bVar13 = Lexem::eq(pLVar17,&local_1c8);
              if (bVar13) {
                bVar7 = true;
                bVar6 = true;
                bVar5 = true;
                bVar4 = true;
                bVar3 = true;
                bVar2 = true;
                bVar14 = true;
                goto LAB_0013cf53;
              }
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              local_1e8.field_2._0_8_ = 0x697261765f646461;
              local_1e8.field_2._8_4_ = 0x656c6261;
              local_1e8._M_string_length = 0xc;
              local_1e8.field_2._M_local_buf[0xc] = '\0';
              local_2d1 = Lexem::eq(pLVar17,&local_1e8);
              bVar8 = true;
              bVar7 = true;
              bVar6 = true;
              bVar5 = true;
              bVar4 = true;
              bVar3 = true;
              bVar2 = true;
              bVar14 = true;
              bVar13 = true;
            }
          }
          if ((bVar13) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2)) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._0_8_ + 1);
          }
          if ((bVar14) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2)) {
            operator_delete(local_1c8._M_dataplus._M_p,
                            CONCAT17(local_1c8.field_2._M_local_buf[7],
                                     local_1c8.field_2._M_allocated_capacity._0_7_) + 1);
          }
          if ((bVar2) && ((Lexem *)local_208._0_8_ != (Lexem *)(local_208 + 0x10))) {
            operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
          }
          if ((bVar3) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2)) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            CONCAT17(local_1a8.field_2._M_local_buf[7],
                                     local_1a8.field_2._M_allocated_capacity._0_7_) + 1);
          }
          cVar10 = (char)local_278;
          if ((bVar4) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2)) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((bVar5) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2)) {
            operator_delete(local_168._M_dataplus._M_p,
                            CONCAT44(local_168.field_2._M_allocated_capacity._4_4_,
                                     local_168.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if ((bVar6) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2)) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          if ((bVar7) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2)) {
            operator_delete(local_128._M_dataplus._M_p,
                            CONCAT44(local_128.field_2._M_allocated_capacity._4_4_,
                                     local_128.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if ((bVar8) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2)) {
            operator_delete(local_108._M_dataplus._M_p,
                            CONCAT44(local_108.field_2._M_allocated_capacity._4_4_,
                                     local_108.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if ((cVar10 == '\0') &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2)) {
            operator_delete(local_e8._M_dataplus._M_p,
                            CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                                     local_e8.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if ((Lexem *)local_2c0._0_8_ != (Lexem *)(local_2c0 + 0x10)) {
            operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
          }
          plVar18 = local_2a0;
          if (local_2d1 == false) {
            get_cargs((Vec<Hpipe::CharGraph::Arg> *)local_2c0,local_298,
                      *(Lexem **)(*local_2a0 + 0x40),local_290,true);
            if (*(int *)(*(long *)(*plVar18 + 0x38) + 0x28) != 1) {
              Lexer::err(local_298->lexer,*(Lexem **)(*plVar18 + 0x40),
                         "xxx in xxx[] should be a variable");
              local_298->ok = false;
            }
            __arg_00 = *(void **)(*local_2a0 + 0x38);
            std::vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>::vector
                      (&local_48,
                       (vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_> *)
                       local_2c0);
            clone(local_298,(__fn *)local_288,local_280,(int)__arg_00 + 8,__arg_00,&local_48,
                  local_290);
            std::vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>::~vector
                      (&local_48);
            this_00 = (vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_> *)
                      local_2c0;
            goto LAB_0013d5e0;
          }
        }
        plVar18 = local_2a0;
        args_2 = (char **)*local_2a0;
        pLVar17 = Pool<Hpipe::Lexem,32>::
                  New<Hpipe::Lexem::Type_const&,Hpipe::Source*const&,char_const*const&,std::__cxx11::string_const&>
                            (local_270,(anon_enum_32 *)(args_2 + 5),(Source **)(args_2 + 6),args_2,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (args_2 + 1));
        ppbVar20 = &local_280->val[3].
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (*local_288 == (pointer)0x0) {
          ppbVar20 = local_288;
        }
        *ppbVar20 = (pointer)pLVar17;
        local_280->val =
             (Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)pLVar17;
        pVVar22 = local_280;
        if ((*(int *)(*plVar18 + 0x28) == 8) || (*(int *)(*plVar18 + 0x28) == 4)) {
          src = (local_290->
                super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>).
                super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>.
                _M_impl.super__Vector_impl_data._M_start;
          pAVar1 = (local_290->
                   super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>).
                   super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (src != pAVar1) {
            local_278 = &pLVar17->str;
            do {
              pLVar19 = src->val;
              local_2c0._16_2_ = 0x28;
              local_2c0._8_8_ = (pointer)0x1;
              local_2c0._0_8_ = (Lexem *)(local_2c0 + 0x10);
              bVar13 = Lexem::eq(pLVar19,OPERATOR,(string *)local_2c0);
              if ((Lexem *)local_2c0._0_8_ != (Lexem *)(local_2c0 + 0x10)) {
                operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
              }
              pCVar9 = local_298;
              if (bVar13) {
                pLVar19 = pLVar19->children[0];
              }
              if (pLVar19->next != (Lexem *)0x0) {
                Lexer::err(local_298->lexer,pLVar19->next,
                           "When a variable is used in a code, it is expected to be a single lexem")
                ;
                pCVar9->ok = false;
              }
              repl_all(local_278,&src->name,&pLVar19->str);
              src = src + 1;
              pVVar22 = extraout_RDX;
            } while (src != pAVar1);
          }
        }
        lVar23 = 7;
        do {
          pLVar19 = ((Lexem *)*local_2a0)->children[lVar23 + -7];
          local_70 = pLVar19;
          if (pLVar19 != (Lexem *)0x0) {
            if (lVar23 == 7) {
              local_258._48_8_ = &local_218;
              local_218._M_allocated_capacity._0_2_ = 0x3e2d;
              local_220 = (Lexem *)0x2;
              local_218._M_local_buf[2] = '\0';
              bVar13 = Lexem::eq((Lexem *)*local_2a0,OPERATOR,(string *)(local_258 + 0x30));
              if (bVar13) {
                bVar14 = true;
                bVar13 = false;
                pVVar22 = extraout_RDX_00;
              }
              else {
                local_258._16_8_ = local_258 + 0x20;
                local_258._32_2_ = 0x2d3c;
                local_258._24_8_ = 2;
                local_258[0x22] = '\0';
                bVar14 = Lexem::eq((Lexem *)*local_2a0,OPERATOR,(string *)(local_258 + 0x10));
                bVar13 = true;
                pVVar22 = extraout_RDX_01;
              }
            }
            else {
              bVar13 = false;
              bVar14 = false;
            }
            if ((bVar13) && ((undefined1 *)local_258._16_8_ != local_258 + 0x20)) {
              operator_delete((void *)local_258._16_8_,
                              CONCAT53(local_258._35_5_,CONCAT12(local_258[0x22],local_258._32_2_))
                              + 1);
              pVVar22 = extraout_RDX_02;
            }
            if ((lVar23 == 7) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._48_8_ != &local_218)) {
              operator_delete((void *)local_258._48_8_,
                              CONCAT53(local_218._M_allocated_capacity._3_5_,
                                       CONCAT12(local_218._M_local_buf[2],
                                                local_218._M_allocated_capacity._0_2_)) + 1);
              pVVar22 = extraout_RDX_03;
            }
            if (bVar14 == false) {
              if (bVar12 && lVar23 == 7) {
                pLVar19 = Pool<Hpipe::Lexem,32>::
                          New<Hpipe::Lexem::Type_const&,Hpipe::Source*const&,char_const*const&,std::__cxx11::string_const&>
                                    (local_270,&pLVar19->type,&pLVar19->source,&pLVar19->beg,
                                     &pLVar19->str);
                pVVar22 = extraout_RDX_04;
              }
              else {
                local_2c0._0_8_ = (Lexem *)0x0;
                local_268 = (Lexem *)0x0;
                clone(local_298,(__fn *)local_2c0,&local_268,(int)&local_70,local_290,0);
                pLVar19 = (Lexem *)local_2c0._0_8_;
                pVVar22 = extraout_RDX_05;
              }
              (&pLVar17->beg)[lVar23] = (char *)pLVar19;
            }
            else {
              local_98 = local_a0;
              to_string<Hpipe::Values<Hpipe::Vec<std::__cxx11::string>>>
                        (&local_90,(Hpipe *)&local_98,pVVar22);
              plVar18 = (long *)std::__cxx11::string::append((char *)&local_90);
              local_268 = (Lexem *)local_258;
              pLVar21 = (Lexem *)(plVar18 + 2);
              if ((Lexem *)*plVar18 == pLVar21) {
                local_258._0_8_ = pLVar21->beg;
                local_258._8_8_ = plVar18[3];
              }
              else {
                local_258._0_8_ = pLVar21->beg;
                local_268 = (Lexem *)*plVar18;
              }
              local_260 = plVar18[1];
              *plVar18 = (long)pLVar21;
              plVar18[1] = 0;
              *(undefined1 *)(plVar18 + 2) = 0;
              plVar18 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_268,(ulong)(pLVar19->str)._M_dataplus._M_p
                                          );
              pLVar21 = (Lexem *)(plVar18 + 2);
              if ((Lexem *)*plVar18 == pLVar21) {
                local_2c0._16_8_ = pLVar21->beg;
                local_2c0._24_8_ = plVar18[3];
                local_2c0._0_8_ = (Lexem *)(local_2c0 + 0x10);
              }
              else {
                local_2c0._16_8_ = pLVar21->beg;
                local_2c0._0_8_ = (Lexem *)*plVar18;
              }
              local_2c0._8_8_ = plVar18[1];
              *plVar18 = (long)pLVar21;
              plVar18[1] = 0;
              *(undefined1 *)(plVar18 + 2) = 0;
              pLVar19 = Pool<Hpipe::Lexem,32>::
                        New<Hpipe::Lexem::Type_const&,Hpipe::Source*const&,char_const*const&,std::__cxx11::string>
                                  (local_270,&pLVar19->type,&pLVar19->source,&pLVar19->beg,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_2c0);
              (&pLVar17->beg)[lVar23] = (char *)pLVar19;
              pVVar22 = extraout_RDX_06;
              if ((Lexem *)local_2c0._0_8_ != (Lexem *)(local_2c0 + 0x10)) {
                operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
                pVVar22 = extraout_RDX_07;
              }
              if (local_268 != (Lexem *)local_258) {
                operator_delete(local_268,(ulong)(local_258._0_8_ + 1));
                pVVar22 = extraout_RDX_08;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
                pVVar22 = extraout_RDX_09;
              }
            }
            *(Lexem **)((&pLVar17->beg)[lVar23] + 0x48) = pLVar17;
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 == 8);
      }
      in_RAX = (Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)*local_2a0;
      pLVar17 = *(Lexem **)((long)(in_RAX + 3) + 8);
      *local_2a0 = (long)pLVar17;
    } while (pLVar17 != (Lexem *)0x0);
  }
  return (int)in_RAX;
}

Assistant:

void CharGraph::clone( Lexem *&beg, Lexem *&end, const Lexem *&l, const Vec<Arg> &args, const char *stop ) {
    for( ; l; l = l->next ) {
        if ( stop and l->eq( Lexem::OPERATOR, stop ) )
            break;

        // variables
        auto keyword = []( const std::string &str ) {
            return str == "eof";
        };
        if ( l->type == Lexem::VARIABLE and not keyword( l->str ) ) {
            clone( beg, end, l->str, l, {}, args );
            continue;
        }

        // function call ( func[ args ] )
        auto is_inline = []( const Lexem *l ) {
            return l->eq( "skip" ) or l->eq( "add_str" ) or l->eq( "clr_str" ) or l->eq( "beg_str" )  or l->eq( "beg_str_next" ) or l->eq( "end_str" )  or l->eq( "end_str_next" ) or
                   l->eq( "add_include" ) or l->eq( "add_prel" ) or l->eq( "add_preliminary" ) or l->eq( "add_variable" );
        };

        bool do_not_clone_ch_0 = false;
        if ( l->eq( Lexem::OPERATOR, "[" ) ) {
            if ( is_inline( l->children[ 0 ] ) ) {
                do_not_clone_ch_0 = true;
            } else {
                // get arguments
                Vec<Arg> cargs = get_cargs( l->children[ 1 ], args, true );

                // find machine
                if ( l->children[ 0 ]->type != Lexem::VARIABLE ) {
                    lexer.err( l->children[ 1 ], "xxx in xxx[] should be a variable" );
                    ok = false;
                }
                clone( beg, end, l->children[ 0 ]->str, l->children[ 0 ], cargs, args );
                continue;
            }
        }

        // default case
        Lexem *res = le_pool.New( l->type, l->source, l->beg, l->str );
        if ( beg ) end->next = res;
        else beg = res;
        end = res;

        // modifications
        switch ( l->type ) {
        case Lexem::STRING:
        case Lexem::CODE:
            for( const Arg &arg : args ) {
                const Lexem *val = arg.val;
                if ( val->eq( Lexem::OPERATOR, "(" ) )
                    val = val->children[ 0 ];
                if ( val->next ) {
                    lexer.err( val->next, "When a variable is used in a code, it is expected to be a single lexem" );
                    ok = false;
                }
                repl_all( res->str, arg.name, val->str );
            }
            break;
        default:
            break;
        }

        for( unsigned i = 0; i < 2; ++i ) {
            if ( const Lexem *ch = l->children[ i ] ) {
                if ( i == 0 and ( l->eq( Lexem::OPERATOR, "->" ) or l->eq( Lexem::OPERATOR, "<-" ) ) )
                    res->children[ i ] = le_pool.New( ch->type, ch->source, ch->beg, to_string( values( calls ) ) + " " + ch->str );
                else if ( i == 0 and do_not_clone_ch_0 )
                    res->children[ i ] = le_pool.New( ch->type, ch->source, ch->beg, ch->str );
                else
                    res->children[ i ] = clone( ch, args );
                res->children[ i ]->parent = res;
            }
        }
    }
}